

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_zisofs.c
# Opt level: O0

void test_write_format_iso9660_zisofs_1(void)

{
  int iVar1;
  mode_t mVar2;
  la_ssize_t lVar3;
  time_t tVar4;
  time_t tVar5;
  char *pcVar6;
  la_int64_t lVar7;
  uint local_834;
  int r;
  uint i;
  size_t used;
  size_t buffsize;
  uchar *buff;
  archive_entry *ae;
  archive *a;
  uchar nullb [1024];
  uchar buff2 [1024];
  
  used = 0x12000;
  memset(&a,0,0x400);
  buffsize = (size_t)malloc(used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                   ,L'l',(uint)((void *)buffsize != (void *)0x0),"buff != NULL",(void *)0x0);
  if (buffsize != 0) {
    ae = (archive_entry *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                     ,L'q',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_iso9660((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                        ,L'r',0,"0",(long)iVar1,"archive_write_set_format_iso9660(a)",ae);
    iVar1 = archive_write_add_filter_none((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                        ,L's',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",ae);
    iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"zisofs","1");
    if (iVar1 == -0x1e) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                     ,L'v');
      test_skipping("zisofs option not supported on this platform");
      iVar1 = archive_write_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'w',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free((void *)buffsize);
    }
    else {
      iVar1 = archive_write_set_option((archive *)ae,(char *)0x0,"pad",(char *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'{',0,"0",(long)iVar1,"archive_write_set_option(a, NULL, \"pad\", NULL)"
                          ,ae);
      iVar1 = archive_write_open_memory((archive *)ae,(void *)buffsize,used,(size_t *)&r);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'|',0,"0",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'\x81',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file1");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x40000);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'\x89',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar3 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'\x8b',0x400,"1024",lVar3,"archive_write_data(a, nullb, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'\x90',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file2");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x800);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'\x98',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar3 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'\x9a',0x400,"1024",lVar3,"archive_write_data(a, nullb, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'\x9f',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file3");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x801);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'§',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar3 = archive_write_data((archive *)ae,&a,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'©',0x400,"1024",lVar3,"archive_write_data(a, nullb, 1024)",ae);
      buff = (uchar *)archive_entry_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'¯',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_atime((archive_entry *)buff,2,0x14);
      archive_entry_set_birthtime((archive_entry *)buff,3,0x1e);
      archive_entry_set_ctime((archive_entry *)buff,4,0x28);
      archive_entry_set_mtime((archive_entry *)buff,5,0x32);
      archive_entry_copy_pathname((archive_entry *)buff,"file4");
      archive_entry_set_mode((archive_entry *)buff,0x81ed);
      archive_entry_set_size((archive_entry *)buff,0x18);
      iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'·',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
      archive_entry_free((archive_entry *)buff);
      lVar3 = archive_write_data((archive *)ae,zisofs_data,0x18);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'¹',0x18,"24",lVar3,"archive_write_data(a, zisofs_data, 24)",ae);
      iVar1 = archive_write_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'¼',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
      iVar1 = archive_write_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'½',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",ae);
      failure("The ISO image size should be 71680 bytes.");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'À',_r,"used",0x11800,"2048 * 35",(void *)0x0);
      for (local_834 = 0; local_834 < 0x8000; local_834 = local_834 + 1) {
        failure("System Area should be all nulls.");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'Å',(ulong)*(byte *)(buffsize + local_834),"buff[i]",0,"0",
                            (void *)0x0);
      }
      failure("Primary Volume Descriptor should be in 16 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ê',(void *)(buffsize + 0x8000),"buff+2048*16","\x01CD001\x01",
                          "primary_id",8,"8",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ì',(void *)(buffsize + 0x8028),"buff+2048*16+0x28",
                          "CDROM                           ","\"CDROM                           \"",
                          0x20,"32",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Í',(void *)(buffsize + 0x8050),"buff+2048*16+0x50","#","volumesize",8,
                          "8",(void *)0x0);
      failure("Supplementary Volume(Joliet) Descriptor should be in 17 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ò',(void *)(buffsize + 0x8800),"buff+2048*17","\x02CD001\x01",
                          "supplementary_id",8,"8",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ó',(void *)(buffsize + 0x8828),"buff+2048*17+0x28","","volumeidu16",
                          0x20,"32",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ô',(void *)(buffsize + 0x8850),"buff+2048*17+0x50","#","volumesize",8,
                          "8",(void *)0x0);
      failure(
             "Date and Time of Primary Volume and Date and Time of Supplementary Volume must be the same."
             );
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ø',(void *)(buffsize + 0x832d),"buff+2048*16+0x32d",
                          (void *)(buffsize + 0x8b2d),"buff+2048*17+0x32d",0x44,"0x44",(void *)0x0);
      failure("Volume Descriptor Set Terminator should be in 18 Logical Sector.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ý',(void *)(buffsize + 0x9000),"buff+2048*18",terminator_id,
                          "terminator_id",8,"8",(void *)0x0);
      for (local_834 = 8; local_834 < 0x800; local_834 = local_834 + 1) {
        failure("Body of Volume Descriptor Set Terminator should be all nulls.");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                            ,L'á',(ulong)*(byte *)(buffsize + (local_834 + 0x9000)),
                            "buff[2048*18+i]",0,"0",(void *)0x0);
      }
      failure("file1 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'æ',(void *)(buffsize + 0xf800),"buff+2048*31",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      failure("file2 image should not be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'é',(void *)(buffsize + 0x10000),"buff+2048*32",&a,"nullb",8,"8",
                          (void *)0x0);
      failure("file3 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ì',(void *)(buffsize + 0x10800),"buff+2048*33",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      failure("file4 image should be zisofs\'ed.");
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ï',(void *)(buffsize + 0x11000),"buff+2048*34",zisofs_magic,
                          "zisofs_magic",8,"8",(void *)0x0);
      ae = (archive_entry *)archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ô',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'õ',0,"0",(long)iVar1,"archive_read_support_format_all(a)",ae);
      iVar1 = archive_read_support_filter_all((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ö',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",ae);
      iVar1 = archive_read_open_memory((archive *)ae,(void *)buffsize,_r);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'÷',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",ae);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ý',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      tVar5 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'þ',tVar4,"archive_entry_atime(ae)",tVar5,"archive_entry_ctime(ae)",
                          (void *)0x0);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      tVar5 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ÿ',tVar4,"archive_entry_atime(ae)",tVar5,"archive_entry_mtime(ae)",
                          (void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ā',".","\".\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ā',(uint)(mVar2 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ă',0x800,"2048",lVar7,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ć',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĉ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ċ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ċ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Č',"file1","\"file1\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'č',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ď',0x40000,"256*1024",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,nullb + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ď',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Đ',nullb + 0x3f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ĕ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ė',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ę',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ę',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ě',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ě',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĝ',0x800,"2048",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,nullb + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ĝ',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ğ',nullb + 0x3f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ģ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĥ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ħ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ħ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ĩ',"file3","\"file3\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ĩ',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ī',0x801,"2049",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,nullb + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ī',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĭ',nullb + 0x3f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ı',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      tVar4 = archive_entry_atime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĳ',2,"2",tVar4,"archive_entry_atime(ae)",(void *)0x0);
      tVar4 = archive_entry_ctime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĵ',4,"4",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
      tVar4 = archive_entry_mtime((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ĵ',5,"5",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar6 = archive_entry_pathname((archive_entry *)buff);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                 ,L'Ķ',"file4","\"file4\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar2 = archive_entry_mode((archive_entry *)buff);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                       ,L'ķ',(uint)(mVar2 == 0x816d),"(S_IFREG | 0555) == archive_entry_mode(ae)",
                       (void *)0x0);
      lVar7 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ĸ',0x8000,"32768",lVar7,"archive_entry_size(ae)",(void *)0x0);
      lVar3 = archive_read_data((archive *)ae,nullb + 0x3f8,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ĺ',0x400,"1024",lVar3,"archive_read_data(a, buff2, 1024)",ae);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ĺ',nullb + 0x3f8,"buff2",&a,"nullb",0x400,"1024",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ŀ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
      iVar1 = archive_read_close((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'ŀ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
      iVar1 = archive_read_free((archive *)ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_zisofs.c"
                          ,L'Ł',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",ae);
      free((void *)buffsize);
    }
  }
  return;
}

Assistant:

static void
test_write_format_iso9660_zisofs_1(void)
{
	unsigned char buff2[1024];
	unsigned char nullb[1024];
	struct archive *a;
	struct archive_entry *ae;
	unsigned char *buff;
	size_t buffsize = 36 * 2048;
	size_t used;
	unsigned int i;
	int r;

	memset(nullb, 0, sizeof(nullb));
	buff = malloc(buffsize);
	assert(buff != NULL);
	if (buff == NULL)
		return;

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_iso9660(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	r = archive_write_set_option(a, NULL, "zisofs", "1");
	if (r == ARCHIVE_FATAL) {
		skipping("zisofs option not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, 0, archive_write_set_option(a, NULL, "pad", NULL));
	assertEqualIntA(a, 0, archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * "file1" has a bunch of attributes and 256K bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file1");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 256*1024);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 1024, archive_write_data(a, nullb, 1024));

	/*
	 * "file2" has a bunch of attributes and 2048 bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 2048);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 1024, archive_write_data(a, nullb, 1024));

	/*
	 * "file3" has a bunch of attributes and 2049 bytes of null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file3");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 2049);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 1024, archive_write_data(a, nullb, 1024));

	/*
	 * "file4" has a bunch of attributes and 24 bytes of zisofs data
	 * which is compressed from 32K bytes null data.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 20);
	archive_entry_set_birthtime(ae, 3, 30);
	archive_entry_set_ctime(ae, 4, 40);
	archive_entry_set_mtime(ae, 5, 50);
	archive_entry_copy_pathname(ae, "file4");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 24);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 24, archive_write_data(a, zisofs_data, 24));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	failure("The ISO image size should be 71680 bytes.");
	assertEqualInt(used, 2048 * 35);

	/* Check System Area. */
	for (i = 0; i < 2048 * 16; i++) {
		failure("System Area should be all nulls.");
		assertEqualInt(buff[i], 0);
	}

	/* Primary Volume. */
	failure("Primary Volume Descriptor should be in 16 Logical Sector.");
	assertEqualMem(buff+2048*16, primary_id, 8);
	assertEqualMem(buff+2048*16+0x28,
	    "CDROM                           ", 32);
	assertEqualMem(buff+2048*16+0x50, volumesize, 8);

	/* Supplementary Volume. */
	failure("Supplementary Volume(Joliet) Descriptor "
	    "should be in 17 Logical Sector.");
	assertEqualMem(buff+2048*17, supplementary_id, 8);
	assertEqualMem(buff+2048*17+0x28, volumeidu16, 32);
	assertEqualMem(buff+2048*17+0x50, volumesize, 8);
	failure("Date and Time of Primary Volume and "
	    "Date and Time of Supplementary Volume "
	    "must be the same.");
	assertEqualMem(buff+2048*16+0x32d, buff+2048*17+0x32d, 0x44);

	/* Terminator. */
	failure("Volume Descriptor Set Terminator "
	    "should be in 18 Logical Sector.");
	assertEqualMem(buff+2048*18, terminator_id, 8);
	for (i = 8; i < 2048; i++) {
		failure("Body of Volume Descriptor Set Terminator "
		    "should be all nulls.");
		assertEqualInt(buff[2048*18+i], 0);
	}

	/* "file1"  Contents is zisofs data. */
	failure("file1 image should be zisofs'ed.");
	assertEqualMem(buff+2048*31, zisofs_magic, 8);
	/* "file2"  Contents is not zisofs data. */
	failure("file2 image should not be zisofs'ed.");
	assertEqualMem(buff+2048*32, nullb, 8);
	/* "file3"  Contents is zisofs data. */
	failure("file3 image should be zisofs'ed.");
	assertEqualMem(buff+2048*33, zisofs_magic, 8);
	/* "file4"  Contents is zisofs data. */
	failure("file4 image should be zisofs'ed.");
	assertEqualMem(buff+2048*34, zisofs_magic, 8);

	/*
	 * Read ISO image.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read Root Directory
	 * Root Directory entry must be in ISO image.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_ctime(ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_mtime(ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assert((S_IFDIR | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));

	/*
	 * Read "file1" which has 256K bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	/* assertEqualInt(3, archive_entry_birthtime(ae)); */
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(256*1024, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Read "file2" which has 2048 bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	/* assertEqualInt(3, archive_entry_birthtime(ae)); */
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Read "file3" which has 2049 bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	/* assertEqualInt(3, archive_entry_birthtime(ae)); */
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(2049, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Read "file4" which has 32K bytes null data.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(2, archive_entry_atime(ae));
	/* assertEqualInt(3, archive_entry_birthtime(ae)); */
	assertEqualInt(4, archive_entry_ctime(ae));
	assertEqualInt(5, archive_entry_mtime(ae));
	assertEqualString("file4", archive_entry_pathname(ae));
	assert((S_IFREG | 0555) == archive_entry_mode(ae));
	assertEqualInt(32768, archive_entry_size(ae));
	assertEqualIntA(a, 1024, archive_read_data(a, buff2, 1024));
	assertEqualMem(buff2, nullb, 1024);

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}